

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O1

string * __thiscall
JtagShiftedData::GetASCIIString_abi_cxx11_
          (string *__return_storage_ptr__,JtagShiftedData *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bits)

{
  pointer puVar1;
  char *pcVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bits_00;
  ulonglong uVar7;
  char number_str [32];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_60;
  ulong local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88 = (long *)CONCAT44(local_88._4_4_,1);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<BitState_const>>
                    (this->mStartSampleIndex,
                     (this->mTdiBits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  puVar1 = (this->mTdiBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bits_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            (puVar1 + -(long)_Var3._M_current);
  if ((long)bits_00 < 9) {
    lVar4 = -8;
    uVar7 = 0;
    do {
      uVar7 = (ulong)(puVar1[lVar4] == '\x01') + uVar7 * 2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    AnalyzerHelpers::GetNumberString(uVar7,ASCII,8,(char *)&local_88,0x20);
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    strlen((char *)&local_88);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)&local_88);
  }
  else {
    GetDecimalString_abi_cxx11_(&local_40,this,bits_00);
    plVar5 = (long *)std::__cxx11::string::insert((ulong)&local_40,0,'\x01');
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_50 = *plVar6;
      lStack_48 = plVar5[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar6;
      local_60 = (long *)*plVar5;
    }
    local_58 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_78 = *plVar6;
      lStack_70 = plVar5[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar6;
      local_88 = (long *)*plVar5;
    }
    local_80 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JtagShiftedData::GetASCIIString( const std::vector<U8>& bits )
{
    std::string ret_val;

    // Check if the value of the number represented by bits is less than 0x100.
    // If it is, we can make an ASCII out of it, otherwise use GetDecimalString()
    std::vector<U8>::const_iterator srch_hi( std::find( bits.begin(), bits.end(), BIT_HIGH ) );
    if( bits.end() - srch_hi <= 8 )
    {
        // Get the numerical value from the bits.
        U64 val;

        // Only get the 8 least significant bits
        std::vector<U8>::const_iterator bsi( bits.end() - 8 );
        for( val = 0; bsi != bits.end(); ++bsi )
            val = ( val << 1 ) | ( *bsi == BIT_HIGH ? 1 : 0 );

        // make a string out of that value
        char number_str[ 32 ];
        AnalyzerHelpers::GetNumberString( val, ASCII, 8, number_str, sizeof( number_str ) );

        ret_val = number_str;
    }
    else
    {
        ret_val = '\'' + GetDecimalString( bits ) + '\'';
    }

    return ret_val;
}